

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.hpp
# Opt level: O0

void __thiscall
jessilib::io::formatted_message::formatted_message<jessilib::io::text&>
          (formatted_message *this,u8string *in_format,text *args)

{
  initializer_list<jessilib::io::text> __l;
  text *local_98;
  allocator<jessilib::io::text> local_75 [13];
  text *local_68;
  text local_60;
  undefined1 local_30 [24];
  text *args_local;
  u8string *in_format_local;
  formatted_message *this_local;
  
  local_30._16_8_ = args;
  args_local = (text *)in_format;
  in_format_local = &this->m_format;
  std::__cxx11::u8string::u8string((u8string *)this,in_format);
  local_68 = &local_60;
  text::text(local_68,(text *)local_30._16_8_);
  local_30._0_8_ = &local_60;
  local_30._8_8_ = 1;
  std::allocator<jessilib::io::text>::allocator(local_75);
  __l._M_len = local_30._8_8_;
  __l._M_array = (iterator)local_30._0_8_;
  std::vector<jessilib::io::text,_std::allocator<jessilib::io::text>_>::vector
            (&this->m_message,__l,local_75);
  std::allocator<jessilib::io::text>::~allocator(local_75);
  local_98 = (text *)local_30;
  do {
    local_98 = local_98 + -1;
    text::~text(local_98);
  } while (local_98 != &local_60);
  return;
}

Assistant:

formatted_message(std::u8string in_format, Args&& ... args)
		: m_format{ std::move(in_format) },
		m_message{ std::forward<Args>(args)... } {
		// Empty ctor body
	}